

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

ptls_t * new_instance(ptls_context_t *ctx,int is_server)

{
  size_t sVar1;
  st_ptls_update_open_count_t *psVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ptls_t *ppVar7;
  long in_FS_OFFSET;
  uint32_t r;
  uint local_38;
  uint uStack_34;
  
  if (ctx->get_time == (ptls_get_time_t *)0x0) {
    __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x140e,"ptls_t *new_instance(ptls_context_t *, int)");
  }
  sVar1 = (ctx->pre_shared_key).identity.len;
  if ((ctx->pre_shared_key).identity.base == (uint8_t *)0x0) {
    if ((((sVar1 != 0) || ((ctx->pre_shared_key).secret.base != (uint8_t *)0x0)) ||
        ((ctx->pre_shared_key).secret.len != 0)) ||
       ((ctx->pre_shared_key).hash != (ptls_hash_algorithm_t *)0x0)) {
      __assert_fail("ctx->pre_shared_key.identity.len == 0 && ctx->pre_shared_key.secret.base == NULL && ctx->pre_shared_key.secret.len == 0 && ctx->pre_shared_key.hash == NULL && \"`ptls_context_t::pre_shared_key` in inconsitent state\""
                    ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                    ,0x1416,"ptls_t *new_instance(ptls_context_t *, int)");
    }
  }
  else if (((sVar1 == 0) || ((ctx->pre_shared_key).secret.base == (uint8_t *)0x0)) ||
          (((ctx->pre_shared_key).secret.len == 0 ||
           ((ctx->pre_shared_key).hash == (ptls_hash_algorithm_t *)0x0)))) {
    __assert_fail("ctx->pre_shared_key.identity.len != 0 && ctx->pre_shared_key.secret.base != NULL && ctx->pre_shared_key.secret.len != 0 && ctx->pre_shared_key.hash != NULL && \"`ptls_context_t::pre_shared_key` in incosistent state\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x1412,"ptls_t *new_instance(ptls_context_t *, int)");
  }
  ppVar7 = (ptls_t *)malloc(0x2b8);
  if (ppVar7 != (ptls_t *)0x0) {
    psVar2 = ctx->update_open_count;
    if (psVar2 != (st_ptls_update_open_count_t *)0x0) {
      (*psVar2->cb)(psVar2,1);
    }
    memset(&ppVar7->state,0,0x2b0);
    ppVar7->ctx = ctx;
    ppVar7->field_0x1e8 = ctx->field_0xb8 & 4 | ppVar7->field_0x1e8 & 0xfa | (byte)is_server & 1;
    puVar3 = *(undefined8 **)(in_FS_OFFSET + -0xd0);
    if (puVar3 == (undefined8 *)0x0) {
      (*ctx->random_bytes)(&local_38,4);
      (ppVar7->log_state).random_ = (float)local_38 * 2.3283064e-10;
      uVar4 = _vsnprintf;
      *(undefined8 *)&(ppVar7->log_state).address.__in6_u = _in6addr_any;
      *(undefined8 *)((long)&(ppVar7->log_state).address.__in6_u + 8) = uVar4;
      *(ulong *)&(ppVar7->log_state).field_0x14 = (ulong)uStack_34;
      *(undefined8 *)&(ppVar7->log_state).state.field_0x4 = 0;
      *(undefined4 *)((long)&(ppVar7->log_state).state.generation + 4) = 0;
    }
    else {
      (ppVar7->log_state).state.generation = puVar3[4];
      uVar4 = puVar3[1];
      uVar5 = puVar3[2];
      uVar6 = puVar3[3];
      *(undefined8 *)&ppVar7->log_state = *puVar3;
      *(undefined8 *)((long)&(ppVar7->log_state).address.__in6_u + 4) = uVar4;
      *(undefined8 *)((long)&(ppVar7->log_state).address.__in6_u + 0xc) = uVar5;
      *(undefined8 *)&(ppVar7->log_state).state = uVar6;
    }
  }
  return ppVar7;
}

Assistant:

static ptls_t *new_instance(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    /* check consistency of `ptls_context_t` before instantiating a connection object */
    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");
    if (ctx->pre_shared_key.identity.base != NULL) {
        assert(ctx->pre_shared_key.identity.len != 0 && ctx->pre_shared_key.secret.base != NULL &&
               ctx->pre_shared_key.secret.len != 0 && ctx->pre_shared_key.hash != NULL &&
               "`ptls_context_t::pre_shared_key` in incosistent state");
    } else {
        assert(ctx->pre_shared_key.identity.len == 0 && ctx->pre_shared_key.secret.base == NULL &&
               ctx->pre_shared_key.secret.len == 0 && ctx->pre_shared_key.hash == NULL &&
               "`ptls_context_t::pre_shared_key` in inconsitent state");
    }

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;

#if PTLS_HAVE_LOG
    if (ptls_log_conn_state_override != NULL) {
        tls->log_state = *ptls_log_conn_state_override;
    } else {
        ptls_log_init_conn_state(&tls->log_state, ctx->random_bytes);
    }
#endif

    return tls;
}